

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  char *pcVar1;
  size_t sVar2;
  char *lvalue;
  String argv;
  anon_union_24_2_13149d16_for_String_3 local_c8;
  anon_union_24_2_13149d16_for_String_3 local_b0;
  anon_union_24_2_13149d16_for_String_3 local_98;
  anon_union_24_2_13149d16_for_String_3 local_80;
  anon_union_24_2_13149d16_for_String_3 local_68;
  anon_union_24_2_13149d16_for_String_3 local_50;
  anon_union_24_2_13149d16_for_String_3 local_38;
  
  pcVar1 = String::allocate((String *)&local_50.data,1);
  *pcVar1 = '-';
  sVar2 = strlen(option);
  pcVar1 = String::allocate((String *)&local_68.data,(size_type)sVar2);
  memcpy(pcVar1,option,sVar2 & 0xffffffff);
  operator+((String *)&local_38.data,(String *)&local_50.data,(String *)&local_68.data);
  pcVar1 = String::allocate((String *)&local_80.data,1);
  *pcVar1 = '=';
  operator+((String *)&local_c8.data,(String *)&local_38.data,(String *)&local_80.data);
  sVar2 = strlen(value);
  pcVar1 = String::allocate((String *)&local_98.data,(size_type)sVar2);
  memcpy(pcVar1,value,sVar2 & 0xffffffff);
  operator+((String *)&local_b0.data,(String *)&local_c8.data,(String *)&local_98.data);
  if ((local_98.buf[0x17] < '\0') && (local_98.data.ptr != (char *)0x0)) {
    operator_delete__(local_98.data.ptr);
  }
  if ((local_c8.buf[0x17] < '\0') && (local_c8.data.ptr != (char *)0x0)) {
    operator_delete__(local_c8.data.ptr);
  }
  if ((local_80.buf[0x17] < '\0') && (local_80.data.ptr != (char *)0x0)) {
    operator_delete__(local_80.data.ptr);
  }
  if ((local_38.buf[0x17] < '\0') && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  if ((local_68.buf[0x17] < '\0') && (local_68.data.ptr != (char *)0x0)) {
    operator_delete__(local_68.data.ptr);
  }
  if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
    operator_delete__(local_50.data.ptr);
  }
  local_c8.data.ptr = (char *)&local_b0;
  if (local_b0.buf[0x17] < '\0') {
    local_c8.data.ptr = local_b0.data.ptr;
  }
  parseArgs(this,1,(char **)&local_c8,false);
  if ((local_b0.buf[0x17] < '\0') &&
     ((anon_union_24_2_13149d16_for_String_3 *)local_b0.data.ptr !=
      (anon_union_24_2_13149d16_for_String_3 *)0x0)) {
    operator_delete__(local_b0.data.ptr);
  }
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}